

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O2

void __thiscall
flow_cutter::BasicCutter::
init<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::PseudoDepthFirstSearch>
          (BasicCutter *this,
          Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstRefIDIDFunc<ArrayIDIDFunc>,_ConstIntIDFunc<1>,_ConstRefIDFunc<RangeIDIDMultiFunc>_>
          *graph,TemporaryData *tmp,PseudoDepthFirstSearch *search_algo,SourceTargetPair p,
          int max_flow_intensity)

{
  AssimilatedNodeSet::clear(this->assimilated);
  BasicNodeSet::clear(&this->reachable[0].node_set);
  AssimilatedNodeSet::clear(this->assimilated + 1);
  BasicNodeSet::clear(&this->reachable[1].node_set);
  UnitFlow::clear(&this->flow);
  this->flow_intensity = 0;
  this->max_flow_intensity = max_flow_intensity;
  BasicNodeSet::
  set_extra_node<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
            ((BasicNodeSet *)this,graph,p.source);
  BasicNodeSet::
  set_extra_node<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
            (&this->reachable[0].node_set,graph,p.source);
  BasicNodeSet::
  set_extra_node<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
            (&this->assimilated[1].node_set,graph,p.target);
  BasicNodeSet::
  set_extra_node<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>>
            (&this->reachable[1].node_set,graph,p.target);
  grow_reachable_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::PseudoDepthFirstSearch>
            (this,graph,tmp,search_algo,0);
  grow_assimilated_sets<flow_cutter::Graph<ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstRefIDIDFunc<ArrayIDIDFunc>,ConstIntIDFunc<1>,ConstRefIDFunc<RangeIDIDMultiFunc>>,flow_cutter::PseudoDepthFirstSearch>
            (this,graph,tmp,search_algo);
  this->cut_available = true;
  return;
}

Assistant:

void init(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo, SourceTargetPair p,
        int max_flow_intensity
    )
    {
        assimilated[source_side].clear();
        reachable[source_side].clear();
        assimilated[target_side].clear();
        reachable[target_side].clear();
        flow.clear();

        flow_intensity = 0;
        this->max_flow_intensity = max_flow_intensity;

        assimilated[source_side].set_extra_node(graph, p.source);
        reachable[source_side].set_extra_node(graph, p.source);
        assimilated[target_side].set_extra_node(graph, p.target);
        reachable[target_side].set_extra_node(graph, p.target);

        grow_reachable_sets(graph, tmp, search_algo, source_side);
        grow_assimilated_sets(graph, tmp, search_algo);

        cut_available = true;
        check_invariants(graph);
    }